

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpmOld.c
# Opt level: O1

Gia_Man_t * Gia_ManDupFf2In(Gia_Man_t *p,int nFlopsOld)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar15 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar11 = (iVar1 - iVar5) + iVar15;
      if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) goto LAB_00579eae;
      iVar1 = p->vCis->pArray[uVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00579e8f;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_00579e70;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_00579e70;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556;
      iVar15 = iVar15 + 1;
      iVar5 = p->nRegs;
    } while (iVar15 < iVar5);
  }
  iVar15 = p->vCis->nSize;
  uVar11 = iVar15 - (iVar5 + nFlopsOld);
  if ((int)uVar11 < iVar15 - p->nRegs) {
    uVar13 = (ulong)uVar11;
    do {
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) {
LAB_00579e70:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_00579e70;
      iVar5 = p->vCis->nSize;
      if (iVar5 - p->nRegs <= (int)uVar13) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a6,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (((int)uVar11 < 0) || (iVar5 <= (int)uVar13)) goto LAB_00579eae;
      iVar5 = p->vCis->pArray[uVar13];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00579e8f;
      p->pObjs[iVar5].Value = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < p->vCis->nSize - p->nRegs);
  }
  pVVar10 = p->vCos;
  uVar13 = (ulong)(uint)pVVar10->nSize;
  if (p->nRegs < pVVar10->nSize) {
    lVar12 = 0;
    do {
      if ((int)uVar13 <= lVar12) goto LAB_00579eae;
      iVar5 = pVVar10->pArray[lVar12];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00579e8f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar5;
      Gia_ManDupFf2In_rec(p_00,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCos;
      uVar13 = (ulong)pVVar10->nSize;
    } while (lVar12 < (long)(uVar13 - (long)p->nRegs));
  }
  pVVar10 = p->vCos;
  uVar13 = (ulong)(uint)pVVar10->nSize;
  if (p->nRegs < pVVar10->nSize) {
    lVar12 = 0;
    do {
      if ((int)uVar13 <= lVar12) {
LAB_00579eae:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = pVVar10->pArray[lVar12];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_00579e8f:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar5;
      uVar14 = (uint)*(undefined8 *)pGVar3;
      uVar11 = pGVar3[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar11 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar14 >> 0x1d & 1 ^ uVar11);
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCos;
      uVar13 = (ulong)pVVar10->nSize;
    } while (lVar12 < (long)(uVar13 - (long)p->nRegs));
  }
  Gia_ManSetRegNum(p_00,nFlopsOld);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFf2In( Gia_Man_t * p, int nFlopsOld )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nFlopsOld; i < Gia_ManPiNum(p); i++ )
        Gia_ManPi(p, i)->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManDupFf2In_rec( pNew, Gia_ObjFanin0(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, nFlopsOld );
    return pNew;
}